

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

void __thiscall sf::priv::GlxContext::createContext(GlxContext *this,GlxContext *shared)

{
  uint *puVar1;
  Display *pDVar2;
  int iVar3;
  uint uVar4;
  Uint32 UVar5;
  undefined8 *puVar6;
  long lVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  long lVar10;
  GLXContext p_Var11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  int local_120;
  int major;
  GLXContext local_118;
  Uint32 local_110;
  int debug;
  int nbConfigs;
  int minor;
  uint fbConfigId;
  Display *local_f8;
  _func_int_Display_ptr_XErrorEvent_ptr *local_f0;
  long local_c0;
  int attributes [4];
  undefined8 local_a0;
  
  UVar5 = (this->super_GlContext).m_settings.attributeFlags;
  if (this->m_pbuffer == 0) {
    iVar3 = XGetWindowAttributes(this->m_display,this->m_window,attributes);
    if (iVar3 == 0) {
      poVar8 = err();
      pcVar13 = "Failed to get the window attributes";
      goto LAB_0013a9be;
    }
    local_f0 = (_func_int_Display_ptr_XErrorEvent_ptr *)
               CONCAT44(local_f0._4_4_,*(undefined4 *)(this->m_display + 0xe0));
    local_f8 = (Display *)XVisualIDFromVisual(local_a0);
    major = 0;
    lVar7 = XGetVisualInfo(this->m_display,3,&fbConfigId);
  }
  else {
    fbConfigId = 0;
    glXQueryDrawable(this->m_display,this->m_pbuffer,0x8013,&fbConfigId);
    attributes[1] = fbConfigId;
    attributes[0] = 0x8013;
    attributes[2] = 0;
    attributes[3] = 0;
    major = 0;
    puVar6 = (undefined8 *)
             glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),attributes,
                               &major);
    if (major == 1) {
      lVar7 = glXGetVisualFromFBConfig(this->m_display,*puVar6);
    }
    else {
      lVar7 = 0;
      if (puVar6 == (undefined8 *)0x0) goto LAB_0013a5e5;
    }
    XFree(puVar6);
  }
LAB_0013a5e5:
  if (lVar7 == 0) {
    poVar8 = err();
    pcVar13 = "Failed to get visual info";
LAB_0013a9be:
    poVar8 = std::operator<<(poVar8,pcVar13);
    std::endl<char,std::char_traits<char>>(poVar8);
    return;
  }
  if (shared == (GlxContext *)0x0) {
    local_118 = (GLXContext)0x0;
  }
  else {
    local_118 = shared->m_context;
  }
  major = 0;
  minor = 0;
  iVar3 = glXQueryVersion(this->m_display);
  if (iVar3 == 0) {
    poVar8 = err();
    poVar8 = std::operator<<(poVar8,
                             "Failed to query GLX version, limited to legacy context creation");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  if ((sfglx_ext_ARB_create_context == 1) && ((1 < major || (2 < minor)))) {
    nbConfigs = 0;
    lVar14 = 0;
    local_110 = UVar5;
    puVar9 = (undefined8 *)
             glXChooseFBConfig(this->m_display,*(undefined4 *)(this->m_display + 0xe0),0);
    puVar6 = puVar9;
    local_c0 = lVar7;
    while( true ) {
      lVar12 = (long)nbConfigs;
      if (lVar12 <= lVar14 || puVar9 == (undefined8 *)0x0) break;
      lVar10 = glXGetVisualFromFBConfig(this->m_display,*puVar6);
      if (lVar10 != 0) {
        if (*(long *)(lVar10 + 8) == *(long *)(lVar7 + 8)) {
          XFree(lVar10);
          goto LAB_0013a71c;
        }
        XFree(lVar10);
      }
      lVar14 = lVar14 + 1;
      puVar6 = puVar6 + 1;
    }
    poVar8 = err();
    poVar8 = std::operator<<(poVar8,
                             "Failed to get GLXFBConfig which corresponds to the window\'s visual");
    std::endl<char,std::char_traits<char>>(poVar8);
    puVar6 = (undefined8 *)0x0;
LAB_0013a71c:
    if ((lVar12 > lVar14 && puVar9 != (undefined8 *)0x0) && this->m_context == (GLXContext)0x0) {
      do {
        uVar4 = (this->super_GlContext).m_settings.majorVersion;
        if (uVar4 == 0) break;
        attributes[0] = 0;
        attributes[1] = 0;
        attributes[2] = 0;
        attributes[3] = 0;
        if ((uVar4 != 1) || (1 < (this->super_GlContext).m_settings.minorVersion)) {
          fbConfigId = 0x2091;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)attributes,(int *)&fbConfigId);
          fbConfigId = (this->super_GlContext).m_settings.majorVersion;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)attributes,(int *)&fbConfigId);
          fbConfigId = 0x2092;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)attributes,(int *)&fbConfigId);
          fbConfigId = (this->super_GlContext).m_settings.minorVersion;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)attributes,(int *)&fbConfigId);
        }
        if (sfglx_ext_ARB_create_context_profile == 1) {
          uVar4 = (this->super_GlContext).m_settings.attributeFlags;
          fbConfigId = 2 - (uVar4 & 1);
          debug = uVar4 >> 2 & 1;
          local_120 = 0x9126;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)attributes,&local_120);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)attributes,
                     (value_type_conflict2 *)&fbConfigId);
          local_120 = 0x2094;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)attributes,&local_120);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)attributes,&debug);
        }
        else {
          if (((this->super_GlContext).m_settings.attributeFlags & 5) != 0) {
            poVar8 = err();
            poVar8 = std::operator<<(poVar8,
                                     "Selecting a profile during context creation is not supported,"
                                    );
            poVar8 = std::operator<<(poVar8,"disabling comptibility and debug");
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          (this->super_GlContext).m_settings.attributeFlags = 0;
        }
        fbConfigId = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)attributes,(int *)&fbConfigId);
        fbConfigId = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)attributes,(int *)&fbConfigId);
        pDVar2 = this->m_display;
        Lock::Lock((Lock *)&fbConfigId,(Mutex *)&(anonymous_namespace)::glxErrorMutex);
        local_f8 = pDVar2;
        local_f0 = (_func_int_Display_ptr_XErrorEvent_ptr *)
                   XSetErrorHandler(anon_unknown.dwarf_fc92d::HandleXError);
        if ((local_118 != (GLXContext)0x0) &&
           (iVar3 = glXMakeCurrent(this->m_display,0,0), iVar3 == 0)) {
          poVar8 = err();
          poVar8 = std::operator<<(poVar8,"Failed to deactivate shared context before sharing");
          std::endl<char,std::char_traits<char>>(poVar8);
          anon_unknown.dwarf_fc92d::GlxErrorHandler::~GlxErrorHandler
                    ((GlxErrorHandler *)&fbConfigId);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)attributes);
          return;
        }
        p_Var11 = (*sf_ptrc_glXCreateContextAttribsARB)
                            (this->m_display,(GLXFBConfig)*puVar6,local_118,1,
                             (int *)attributes._0_8_);
        this->m_context = p_Var11;
        if (p_Var11 == (GLXContext)0x0) {
          UVar5 = 0;
          if ((this->super_GlContext).m_settings.attributeFlags == 0) {
            uVar4 = (this->super_GlContext).m_settings.minorVersion;
            if (uVar4 == 0) {
              puVar1 = &(this->super_GlContext).m_settings.majorVersion;
              *puVar1 = *puVar1 - 1;
              uVar4 = 9;
            }
            else {
              uVar4 = uVar4 - 1;
            }
            (this->super_GlContext).m_settings.minorVersion = uVar4;
            UVar5 = local_110;
          }
          (this->super_GlContext).m_settings.attributeFlags = UVar5;
        }
        anon_unknown.dwarf_fc92d::GlxErrorHandler::~GlxErrorHandler((GlxErrorHandler *)&fbConfigId);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)attributes);
      } while (this->m_context == (GLXContext)0x0);
    }
    lVar7 = local_c0;
    if (puVar9 != (undefined8 *)0x0) {
      XFree(puVar9);
      lVar7 = local_c0;
    }
  }
  if (this->m_context == (GLXContext)0x0) {
    (this->super_GlContext).m_settings.majorVersion = 2;
    (this->super_GlContext).m_settings.minorVersion = 1;
    (this->super_GlContext).m_settings.attributeFlags = 0;
    if ((local_118 != (GLXContext)0x0) && (iVar3 = glXMakeCurrent(this->m_display,0,0), iVar3 == 0))
    {
      poVar8 = err();
      pcVar13 = "Failed to deactivate shared context before sharing";
      goto LAB_0013a9be;
    }
    p_Var11 = (GLXContext)glXCreateContext(this->m_display,lVar7,local_118,1);
    this->m_context = p_Var11;
    if (p_Var11 == (GLXContext)0x0) {
      poVar8 = err();
      poVar8 = std::operator<<(poVar8,"Failed to create an OpenGL context for this window");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
  }
  XFree(lVar7);
  return;
}

Assistant:

void GlxContext::createContext(GlxContext* shared)
{
    // Get a working copy of the context settings
    ContextSettings settings = m_settings;

    XVisualInfo* visualInfo = NULL;

    if (m_pbuffer)
    {
        unsigned int fbConfigId = 0;

        glXQueryDrawable(m_display, m_pbuffer, GLX_FBCONFIG_ID, &fbConfigId);

        int attributes[] =
        {
            GLX_FBCONFIG_ID, static_cast<int>(fbConfigId),
            0,               0
        };

        int count = 0;
        GLXFBConfig* fbconfig = glXChooseFBConfig(m_display, DefaultScreen(m_display), attributes, &count);

        if (count == 1)
            visualInfo = glXGetVisualFromFBConfig(m_display, *fbconfig);

        if (fbconfig)
            XFree(fbconfig);
    }
    else
    {
        // Retrieve the attributes of the target window
        XWindowAttributes windowAttributes;
        if (XGetWindowAttributes(m_display, m_window, &windowAttributes) == 0)
        {
            err() << "Failed to get the window attributes" << std::endl;
            return;
        }

        // Get its visuals
        XVisualInfo tpl;
        tpl.screen   = DefaultScreen(m_display);
        tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
        int nbVisuals = 0;
        visualInfo = XGetVisualInfo(m_display, VisualIDMask | VisualScreenMask, &tpl, &nbVisuals);
    }

    if (!visualInfo)
    {
        err() << "Failed to get visual info" << std::endl;
        return;
    }

    // Get the context to share display lists with
    GLXContext toShare = shared ? shared->m_context : NULL;

    // There are no GLX versions prior to 1.0
    int major = 0;
    int minor = 0;

    if (!glXQueryVersion(m_display, &major, &minor))
        err() << "Failed to query GLX version, limited to legacy context creation" << std::endl;

    // Check if glXCreateContextAttribsARB is available (requires GLX 1.3 or greater)
    bool hasCreateContextArb = (sfglx_ext_ARB_create_context == sfglx_LOAD_SUCCEEDED) && ((major > 1) || (minor >= 3));

    // Create the OpenGL context -- first try using glXCreateContextAttribsARB
    if (hasCreateContextArb)
    {
        // Get a GLXFBConfig that matches the window's visual, for glXCreateContextAttribsARB
        GLXFBConfig* config = NULL;

        // We don't supply attributes to match against, since
        // the visual we are matching against was already
        // deemed suitable in selectBestVisual()
        int nbConfigs = 0;
        GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

        for (int i = 0; configs && (i < nbConfigs); ++i)
        {
            XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

            if (!visual)
                continue;

            if (visual->visualid == visualInfo->visualid)
            {
                config = &configs[i];
                XFree(visual);
                break;
            }

            XFree(visual);
        }

        if (!config)
            err() << "Failed to get GLXFBConfig which corresponds to the window's visual" << std::endl;

        while (config && !m_context && m_settings.majorVersion)
        {
            std::vector<int> attributes;

            // Check if the user requested a specific context version (anything > 1.1)
            if ((m_settings.majorVersion > 1) || ((m_settings.majorVersion == 1) && (m_settings.minorVersion > 1)))
            {
                attributes.push_back(GLX_CONTEXT_MAJOR_VERSION_ARB);
                attributes.push_back(m_settings.majorVersion);
                attributes.push_back(GLX_CONTEXT_MINOR_VERSION_ARB);
                attributes.push_back(m_settings.minorVersion);
            }

            // Check if setting the profile is supported
            if (sfglx_ext_ARB_create_context_profile == sfglx_LOAD_SUCCEEDED)
            {
                int profile = (m_settings.attributeFlags & ContextSettings::Core) ? GLX_CONTEXT_CORE_PROFILE_BIT_ARB : GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                int debug = (m_settings.attributeFlags & ContextSettings::Debug) ? GLX_CONTEXT_DEBUG_BIT_ARB : 0;

                attributes.push_back(GLX_CONTEXT_PROFILE_MASK_ARB);
                attributes.push_back(profile);
                attributes.push_back(GLX_CONTEXT_FLAGS_ARB);
                attributes.push_back(debug);
            }
            else
            {
                if ((m_settings.attributeFlags & ContextSettings::Core) || (m_settings.attributeFlags & ContextSettings::Debug))
                    err() << "Selecting a profile during context creation is not supported,"
                          << "disabling comptibility and debug" << std::endl;

                m_settings.attributeFlags = ContextSettings::Default;
            }

            // Append the terminating 0
            attributes.push_back(0);
            attributes.push_back(0);

            // RAII GLX error handler (we simply ignore errors here)
            // On an error, glXCreateContextAttribsARB will return 0 anyway
            GlxErrorHandler handler(m_display);

            if (toShare)
            {
                if (!glXMakeCurrent(m_display, None, NULL))
                {
                    err() << "Failed to deactivate shared context before sharing" << std::endl;
                    return;
                }
            }

            // Create the context
            m_context = glXCreateContextAttribsARB(m_display, *config, toShare, true, &attributes[0]);

            if (!m_context)
            {
                // If we couldn't create the context, first try disabling flags,
                // then lower the version number and try again -- stop at 0.0
                // Invalid version numbers will be generated by this algorithm (like 3.9), but we really don't care
                if (m_settings.attributeFlags != ContextSettings::Default)
                {
                    m_settings.attributeFlags = ContextSettings::Default;
                }
                else if (m_settings.minorVersion > 0)
                {
                    // If the minor version is not 0, we decrease it and try again
                    m_settings.minorVersion--;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
                else
                {
                    // If the minor version is 0, we decrease the major version
                    m_settings.majorVersion--;
                    m_settings.minorVersion = 9;

                    m_settings.attributeFlags = settings.attributeFlags;
                }
            }
        }

        if (configs)
            XFree(configs);
    }

    // If glXCreateContextAttribsARB failed, use glXCreateContext
    if (!m_context)
    {
        // set the context version to 2.1 (arbitrary) and disable flags
        m_settings.majorVersion = 2;
        m_settings.minorVersion = 1;
        m_settings.attributeFlags = ContextSettings::Default;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

        if (toShare)
        {
            if (!glXMakeCurrent(m_display, None, NULL))
            {
                err() << "Failed to deactivate shared context before sharing" << std::endl;
                return;
            }
        }

        // Create the context, using the target window's visual
        m_context = glXCreateContext(m_display, visualInfo, toShare, true);

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::createContext()" << std::endl;
#endif
    }

    if (!m_context)
        err() << "Failed to create an OpenGL context for this window" << std::endl;

    // Free the visual info
    XFree(visualInfo);
}